

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_dump_(char *title,void *addr,size_t size)

{
  byte bVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int iVar4;
  char *__format;
  uint local_54;
  ulong uStack_40;
  uchar byte;
  size_t off;
  size_t line_end;
  size_t truncate;
  size_t line_beg;
  size_t size_local;
  void *addr_local;
  char *title_local;
  
  line_end = 0;
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    line_beg = size;
    if (0x400 < size) {
      line_end = size - 0x400;
      line_beg = 0x400;
    }
    iVar4 = 2;
    if (acutest_case_name_[0] != '\0') {
      iVar4 = 3;
    }
    acutest_line_indent_(iVar4);
    sVar2 = strlen(title);
    __format = "%s:\n";
    if (title[sVar2 - 1] == ':') {
      __format = "%s\n";
    }
    printf(__format,title);
    for (truncate = 0; truncate < line_beg; truncate = truncate + 0x10) {
      iVar4 = 3;
      if (acutest_case_name_[0] != '\0') {
        iVar4 = 4;
      }
      acutest_line_indent_(iVar4);
      printf("%08lx: ",truncate);
      for (uStack_40 = truncate; uStack_40 < truncate + 0x10; uStack_40 = uStack_40 + 1) {
        if (uStack_40 < line_beg) {
          printf(" %02x",(ulong)*(byte *)((long)addr + uStack_40));
        }
        else {
          printf("   ");
        }
      }
      printf("  ");
      for (uStack_40 = truncate;
          (uStack_40 < truncate + 0x10 &&
          (bVar1 = *(byte *)((long)addr + uStack_40), uStack_40 < line_beg));
          uStack_40 = uStack_40 + 1) {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)(uint)bVar1] & 2) == 0) {
          local_54 = (uint)bVar1;
        }
        else {
          local_54 = 0x2e;
        }
        printf("%c",(ulong)local_54);
      }
      printf("\n");
    }
    if (line_end != 0) {
      iVar4 = 3;
      if (acutest_case_name_[0] != '\0') {
        iVar4 = 4;
      }
      acutest_line_indent_(iVar4);
      printf("           ... (and more %u bytes)\n",line_end & 0xffffffff);
    }
  }
  return;
}

Assistant:

void
acutest_dump_(const char* title, const void* addr, size_t size)
{
    static const size_t BYTES_PER_LINE = 16;
    size_t line_beg;
    size_t truncate = 0;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    if(size > TEST_DUMP_MAXSIZE) {
        truncate = size - TEST_DUMP_MAXSIZE;
        size = TEST_DUMP_MAXSIZE;
    }

    acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
    printf((title[strlen(title)-1] == ':') ? "%s\n" : "%s:\n", title);

    for(line_beg = 0; line_beg < size; line_beg += BYTES_PER_LINE) {
        size_t line_end = line_beg + BYTES_PER_LINE;
        size_t off;

        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("%08lx: ", (unsigned long)line_beg);
        for(off = line_beg; off < line_end; off++) {
            if(off < size)
                printf(" %02x", ((const unsigned char*)addr)[off]);
            else
                printf("   ");
        }

        printf("  ");
        for(off = line_beg; off < line_end; off++) {
            unsigned char byte = ((const unsigned char*)addr)[off];
            if(off < size)
                printf("%c", (iscntrl(byte) ? '.' : byte));
            else
                break;
        }

        printf("\n");
    }

    if(truncate > 0) {
        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("           ... (and more %u bytes)\n", (unsigned) truncate);
    }
}